

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
::jls_codec(jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
            *this,uint32_t *param_2,undefined8 *param_3)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  
  uVar3 = param_2[0];
  uVar4 = param_2[1];
  uVar5 = *(ulong *)(param_2 + 2) & 0xffffffff | 0x100000000;
  if (*(int *)(param_3 + 1) != 0) {
    uVar5 = *(ulong *)(param_2 + 2);
  }
  (this->super_decoder_strategy)._vptr_decoder_strategy =
       (_func_int **)&PTR__decoder_strategy_0013f310;
  (this->super_decoder_strategy).frame_info_.width = uVar3;
  (this->super_decoder_strategy).frame_info_.height = uVar4;
  (this->super_decoder_strategy).frame_info_.bits_per_sample = (int)uVar5;
  (this->super_decoder_strategy).frame_info_.component_count = (int)(uVar5 >> 0x20);
  uVar1 = *param_3;
  uVar2 = param_3[1];
  (this->super_decoder_strategy).parameters_.near_lossless = (int)uVar1;
  (this->super_decoder_strategy).parameters_.restart_interval = (int)((ulong)uVar1 >> 0x20);
  (this->super_decoder_strategy).parameters_.interleave_mode = (int)uVar2;
  (this->super_decoder_strategy).parameters_.transformation = (int)((ulong)uVar2 >> 0x20);
  *(undefined4 *)&(this->super_decoder_strategy).parameters_.output_bgr =
       *(undefined4 *)(param_3 + 2);
  (this->super_decoder_strategy).process_line_._M_t.
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl = (process_line *)0x0;
  (this->super_decoder_strategy).read_cache_ = 0;
  (this->super_decoder_strategy).valid_bits_ = 0;
  (this->super_decoder_strategy).position_ = (uint8_t *)0x0;
  (this->super_decoder_strategy).end_position_ = (uint8_t *)0x0;
  (this->super_decoder_strategy).position_ff_ = (uint8_t *)0x0;
  (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)&PTR__jls_codec_0013f6c8;
  (this->rect_).X = 0;
  (this->rect_).Y = 0;
  (this->rect_).Width = 0;
  (this->rect_).Height = 0;
  this->width_ = *param_2;
  this->restart_interval_ = 0;
  this->restart_interval_counter_ = 0;
  this->t1_ = 0;
  this->t2_ = 0;
  *(undefined8 *)((long)&this->t2_ + 1) = 0;
  std::array<charls::context_regular_mode,_365UL>::array(&this->contexts_);
  std::array<charls::context_run_mode,_2UL>::array(&this->context_run_mode_);
  this->run_index_ = 0;
  this->previous_line_ = (pixel_type *)0x0;
  this->current_line_ = (pixel_type *)0x0;
  this->quantization_ = (int8_t *)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((*(int *)(param_3 + 1) == 0) &&
     ((this->super_decoder_strategy).frame_info_.component_count != 1)) {
    __assert_fail("(parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) || parameters.interleave_mode != interleave_mode::none"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x6b,
                  "charls::jls_codec<charls::lossless_traits<charls::quad<unsigned char>, 8>, charls::decoder_strategy>::jls_codec(Traits, const frame_info &, const coding_parameters &) [Traits = charls::lossless_traits<charls::quad<unsigned char>, 8>, Strategy = charls::decoder_strategy]"
                 );
  }
  return;
}

Assistant:

jls_codec(Traits traits, const frame_info& frame_info, const coding_parameters& parameters) noexcept :
        Strategy{update_component_count(frame_info, parameters), parameters},
        traits_{std::move(traits)},
        width_{frame_info.width}
    {
        ASSERT((parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) ||
               parameters.interleave_mode != interleave_mode::none);
        ASSERT(traits_.is_valid());
    }